

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall icu_63::Locale::addLikelySubtags(Locale *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t sLength;
  size_t sVar2;
  char *maximizedLocaleID_00;
  EVP_PKEY_CTX *ctx;
  int32_t reslen;
  char *buffer;
  undefined1 local_58 [4];
  int32_t maximizedLocaleIDCapacity;
  CharString maximizedLocaleID;
  UErrorCode *status_local;
  Locale *this_local;
  
  maximizedLocaleID._56_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    CharString::CharString((CharString *)local_58);
    sVar2 = strlen(this->fullName);
    buffer._4_4_ = (int32_t)sVar2;
    while( true ) {
      maximizedLocaleID_00 =
           CharString::getAppendBuffer
                     ((CharString *)local_58,buffer._4_4_,buffer._4_4_,
                      (int32_t *)((long)&buffer + 4),(UErrorCode *)maximizedLocaleID._56_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)maximizedLocaleID._56_8_);
      if (UVar1 != '\0') break;
      sLength = uloc_addLikelySubtags_63
                          (this->fullName,maximizedLocaleID_00,buffer._4_4_,
                           (UErrorCode *)maximizedLocaleID._56_8_);
      if (*(int *)maximizedLocaleID._56_8_ != 0xf) {
        UVar1 = ::U_FAILURE(*(UErrorCode *)maximizedLocaleID._56_8_);
        if (UVar1 == '\0') {
          CharString::append((CharString *)local_58,maximizedLocaleID_00,sLength,
                             (UErrorCode *)maximizedLocaleID._56_8_);
          if (*(int *)maximizedLocaleID._56_8_ == -0x7c) {
            *(undefined4 *)maximizedLocaleID._56_8_ = 0;
          }
          UVar1 = ::U_FAILURE(*(UErrorCode *)maximizedLocaleID._56_8_);
          if (UVar1 == '\0') {
            ctx = (EVP_PKEY_CTX *)CharString::data((CharString *)local_58);
            init(this,ctx);
            UVar1 = isBogus(this);
            if (UVar1 != '\0') {
              *(undefined4 *)maximizedLocaleID._56_8_ = 1;
            }
          }
        }
        break;
      }
      *(undefined4 *)maximizedLocaleID._56_8_ = 0;
      buffer._4_4_ = sLength;
    }
    CharString::~CharString((CharString *)local_58);
  }
  return;
}

Assistant:

void
Locale::addLikelySubtags(UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }

    // The maximized locale ID string is often longer, but there is no good
    // heuristic to estimate just how much longer. Leave that to CharString.
    CharString maximizedLocaleID;
    int32_t maximizedLocaleIDCapacity = static_cast<int32_t>(uprv_strlen(fullName));

    char* buffer;
    int32_t reslen;

    for (;;) {
        buffer = maximizedLocaleID.getAppendBuffer(
                /*minCapacity=*/maximizedLocaleIDCapacity,
                /*desiredCapacityHint=*/maximizedLocaleIDCapacity,
                maximizedLocaleIDCapacity,
                status);

        if (U_FAILURE(status)) {
            return;
        }

        reslen = uloc_addLikelySubtags(
                fullName,
                buffer,
                maximizedLocaleIDCapacity,
                &status);

        if (status != U_BUFFER_OVERFLOW_ERROR) {
            break;
        }

        maximizedLocaleIDCapacity = reslen;
        status = U_ZERO_ERROR;
    }

    if (U_FAILURE(status)) {
        return;
    }

    maximizedLocaleID.append(buffer, reslen, status);
    if (status == U_STRING_NOT_TERMINATED_WARNING) {
        status = U_ZERO_ERROR;  // Terminators provided by CharString.
    }

    if (U_FAILURE(status)) {
        return;
    }

    init(maximizedLocaleID.data(), /*canonicalize=*/FALSE);
    if (isBogus()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
}